

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O0

char * unslashquote(char *line,char *param)

{
  char *pcVar1;
  bool bVar2;
  char local_19;
  char *pcStack_18;
  char out;
  char *param_local;
  char *line_local;
  
  pcStack_18 = param;
  pcVar1 = line;
LAB_0012201c:
  param_local = pcVar1;
  bVar2 = false;
  if (*param_local != '\0') {
    bVar2 = *param_local != '\"';
  }
  if (!bVar2) {
    *pcStack_18 = '\0';
    return param_local;
  }
  if (*param_local == '\\') goto code_r0x00122059;
  *pcStack_18 = *param_local;
  param_local = param_local + 1;
  goto LAB_00122100;
code_r0x00122059:
  local_19 = param_local[1];
  pcVar1 = param_local + 1;
  if (local_19 != '\0') {
    if (local_19 == 'n') {
      local_19 = '\n';
    }
    else if (local_19 == 'r') {
      local_19 = '\r';
    }
    else if (local_19 == 't') {
      local_19 = '\t';
    }
    else if (local_19 == 'v') {
      local_19 = '\v';
    }
    *pcStack_18 = local_19;
    param_local = param_local + 2;
LAB_00122100:
    pcStack_18 = pcStack_18 + 1;
    pcVar1 = param_local;
  }
  goto LAB_0012201c;
}

Assistant:

static const char *unslashquote(const char *line, char *param)
{
  while(*line && (*line != '\"')) {
    if(*line == '\\') {
      char out;
      line++;

      /* default is to output the letter after the backslash */
      switch(out = *line) {
      case '\0':
        continue; /* this'll break out of the loop */
      case 't':
        out = '\t';
        break;
      case 'n':
        out = '\n';
        break;
      case 'r':
        out = '\r';
        break;
      case 'v':
        out = '\v';
        break;
      }
      *param++ = out;
      line++;
    }
    else
      *param++ = *line++;
  }
  *param = '\0'; /* always null-terminate */
  return line;
}